

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  undefined1 local_2a8 [8];
  cmGeneratedFileStream fout;
  undefined1 local_38 [8];
  string filename;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  filename.field_2._8_8_ = lg;
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  fout._615_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
            ((string *)local_38,psVar2,&fout.field_0x267,&this->ProjectName,(char (*) [13])0xfce6b2)
  ;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2a8,(string *)local_38,false,None);
  bVar1 = std::ios::operator!((ios *)(local_2a8 + (long)*(_func_int **)((long)local_2a8 + -0x18)));
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_2a8,"#Generated by ");
    psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)psVar2);
    std::operator<<(poVar3,", do not edit.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2a8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateDummyKateProjectFile(
  const cmLocalGenerator& lg) const
{
  std::string filename =
    cmStrCat(lg.GetBinaryDirectory(), '/', this->ProjectName, ".kateproject");
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}